

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O0

uint32_t __thiscall xray_re::xr_level_ai::vertex_id(xr_level_ai *this,fvector3 *position)

{
  ai_node *__last;
  ai_node *node;
  bool bVar1;
  float fVar2;
  float local_5c;
  float y;
  float y0;
  size_t node_id;
  ai_node *it;
  ai_node *end;
  ai_node sample;
  fvector3 *position_local;
  xr_level_ai *this_local;
  
  sample._20_8_ = position;
  vertex_position(this,(uint32_t *)&sample.cover,&sample.plane,position);
  __last = this->m_nodes + this->m_num_nodes;
  node_id = (size_t)std::lower_bound<xray_re::ai_node_const*,xray_re::ai_node>
                              (this->m_nodes,__last,(ai_node *)((long)&end + 4));
  if (((ai_node *)node_id == __last) || (((ai_node *)node_id)->packed_xz != sample._12_4_)) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    _y = (long)(node_id - (long)this->m_nodes) / 0x1c;
    local_5c = vertex_plane_y(this,(ai_node *)node_id,*(float *)sample._20_8_,
                              *(float *)(sample._20_8_ + 8));
LAB_001cf8fa:
    while( true ) {
      node = (ai_node *)(node_id + 0x1c);
      bVar1 = false;
      if (node != __last) {
        bVar1 = *(int *)(node_id + 0x30) == sample._12_4_;
      }
      if (!bVar1) break;
      fVar2 = vertex_plane_y(this,node,*(float *)sample._20_8_,*(float *)(sample._20_8_ + 8));
      node_id = (size_t)node;
      if (local_5c <= *(float *)(sample._20_8_ + 4)) goto LAB_001cf99e;
      if ((fVar2 <= *(float *)(sample._20_8_ + 4)) ||
         (fVar2 - *(float *)(sample._20_8_ + 4) < local_5c - *(float *)(sample._20_8_ + 4)))
      goto LAB_001cf9d9;
    }
    this_local._4_4_ = (uint32_t)_y;
  }
  return this_local._4_4_;
LAB_001cf99e:
  if ((fVar2 <= *(float *)(sample._20_8_ + 4)) &&
     (*(float *)(sample._20_8_ + 4) - fVar2 < *(float *)(sample._20_8_ + 4) - local_5c)) {
LAB_001cf9d9:
    _y = ((long)node - (long)this->m_nodes) / 0x1c;
    local_5c = fVar2;
  }
  goto LAB_001cf8fa;
}

Assistant:

uint32_t xr_level_ai::vertex_id(const fvector3& position) const
{
	ai_node sample;
	vertex_position(sample.packed_xz, sample.packed_y, position);
	const ai_node* end = m_nodes + m_num_nodes;
	const ai_node* it = std::lower_bound(static_cast<const ai_node*>(m_nodes), end, sample);
	if (it == end || it->packed_xz != sample.packed_xz)
		return AI_MAP_BAD_NODE;

	size_t node_id = it - m_nodes;
	float y0 = vertex_plane_y(*it, position.x, position.z);
	while (++it != end && it->packed_xz == sample.packed_xz) {
		float y = vertex_plane_y(*it, position.x, position.z);
		if (position.y < y0) {
			if (position.y < y && (y0 - position.y) <= (y - position.y))
				continue;
		} else if (position.y < y || (position.y - y0) <= (position.y - y)) {
			continue;
		}
		node_id = it - m_nodes;
		y0 = y;
	}
	return uint32_t(node_id & UINT32_MAX);
}